

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2::isNormalizedUTF8(Normalizer2 *this,StringPiece s,UErrorCode *errorCode)

{
  int iVar1;
  bool bVar2;
  StringPiece utf8;
  UnicodeString local_60;
  
  utf8.ptr_ = s._8_8_;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    utf8._8_8_ = errorCode;
    UnicodeString::fromUTF8(&local_60,(UnicodeString *)s.ptr_,utf8);
    iVar1 = (*(this->super_UObject)._vptr_UObject[0xb])(this,&local_60,errorCode);
    bVar2 = (char)iVar1 != '\0';
    UnicodeString::~UnicodeString(&local_60);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

UBool
Normalizer2::isNormalizedUTF8(StringPiece s, UErrorCode &errorCode) const {
    return U_SUCCESS(errorCode) && isNormalized(UnicodeString::fromUTF8(s), errorCode);
}